

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statistics.cc
# Opt level: O0

RC __thiscall
StatisticsMgr::Register(StatisticsMgr *this,char *psKey,Stat_Operation op,int *piValue)

{
  Boolean BVar1;
  int iVar2;
  Statistic *local_40;
  Statistic *pStat;
  int iCount;
  int i;
  int *piValue_local;
  Stat_Operation op_local;
  char *psKey_local;
  StatisticsMgr *this_local;
  
  local_40 = (Statistic *)0x0;
  if ((psKey == (char *)0x0) || ((op != STAT_ADDONE && (piValue == (int *)0x0)))) {
    this_local._4_4_ = 0x2329;
  }
  else {
    iVar2 = LinkList<Statistic>::GetLength(&this->llStats);
    for (pStat._4_4_ = 0; pStat._4_4_ < iVar2; pStat._4_4_ = pStat._4_4_ + 1) {
      local_40 = LinkList<Statistic>::operator[](&this->llStats,pStat._4_4_);
      BVar1 = Statistic::operator==(local_40,psKey);
      if (BVar1 != '\0') break;
    }
    if (pStat._4_4_ == iVar2) {
      local_40 = (Statistic *)operator_new(0x10);
      Statistic::Statistic(local_40,psKey);
    }
    switch(op) {
    case STAT_ADDONE:
      local_40->iValue = local_40->iValue + 1;
      break;
    case STAT_ADDVALUE:
      local_40->iValue = *piValue + local_40->iValue;
      break;
    case STAT_SETVALUE:
      local_40->iValue = *piValue;
      break;
    case STAT_MULTVALUE:
      local_40->iValue = *piValue * local_40->iValue;
      break;
    case STAT_DIVVALUE:
      local_40->iValue = local_40->iValue / *piValue;
      break;
    case STAT_SUBVALUE:
      local_40->iValue = local_40->iValue - *piValue;
    }
    if ((pStat._4_4_ == iVar2) &&
       (LinkList<Statistic>::Append(&this->llStats,local_40), local_40 != (Statistic *)0x0)) {
      Statistic::~Statistic(local_40);
      operator_delete(local_40);
    }
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

RC StatisticsMgr::Register (const char *psKey, const Stat_Operation op,
      const int *const piValue)
{
   int i, iCount;
   Statistic *pStat = NULL;

   if (psKey==NULL || (op != STAT_ADDONE && piValue == NULL))
      return STAT_INVALID_ARGS;

   iCount = llStats.GetLength();

   for (i=0; i < iCount; i++) {
      pStat = llStats[i];
      if (*pStat == psKey)
         break;
   }

   // Check to see if we found the Stat
   if (i==iCount)
      // We haven't found it so create a new statistic
      // with the key psKey and initial value of 0.
      pStat = new Statistic( psKey );

   // Now perform the operation over the statistic
   switch (op) {
      case STAT_ADDONE:
         pStat->iValue++;
         break;
      case STAT_ADDVALUE:
         pStat->iValue += *piValue;
         break;
      case STAT_SETVALUE:
         pStat->iValue = *piValue;
         break;
      case STAT_MULTVALUE:
         pStat->iValue *= *piValue;
         break;
      case STAT_DIVVALUE:
         pStat->iValue = (int) (pStat->iValue/(*piValue));
         break;
      case STAT_SUBVALUE:
         pStat->iValue -= *piValue;
         break;
   };

   // Finally, if the statistic wasn't in the original list then add it to
   // the list.
   //  JASON:: Confirm that it makes a copy of the object in line 229 of
   //  linkedlist.h.
   if (i==iCount) {
      llStats.Append(*pStat);
      delete pStat;
   }

   return 0;
}